

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall State::State(State *this,int w,int h)

{
  uint uVar1;
  unsigned_long __res;
  int *__first;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  State local_58;
  
  uVar1 = h * w;
  uVar4 = 0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar2 = (long)(int)uVar1 * 4;
  }
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  __first = (int *)operator_new__(uVar2);
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    __first[uVar4] = (int)uVar4;
  }
  uVar2 = std::chrono::_V2::system_clock::now();
  local_58.tiles = (int **)(uVar2 % 0x7fffffff + (ulong)(uVar2 % 0x7fffffff == 0));
  std::shuffle<int*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (__first,__first + (int)uVar1,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_58);
  State(&local_58,w,h,__first);
  operator=(this,&local_58);
  ~State(&local_58);
  operator_delete__(__first);
  return;
}

Assistant:

State::State(int w, int h) {
    auto numbers = new int[w * h];
    for (int i = 0; i < w * h; i++) {
        numbers[i] = i;
    }

    long seed = std::chrono::high_resolution_clock::now().time_since_epoch().count();
    std::shuffle(&numbers[0], &numbers[w * h], std::default_random_engine(seed));

    *this = State(w, h, numbers);
    delete[] numbers;
}